

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ConstantPaddingLayerParams::InternalSwap
          (ConstantPaddingLayerParams *this,ConstantPaddingLayerParams *other)

{
  bool bVar1;
  float fVar2;
  intptr_t iVar3;
  
  iVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar3;
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->padamounts_,&other->padamounts_);
  fVar2 = this->value_;
  this->value_ = other->value_;
  other->value_ = fVar2;
  bVar1 = this->padtogivenoutputsizemode_;
  this->padtogivenoutputsizemode_ = other->padtogivenoutputsizemode_;
  other->padtogivenoutputsizemode_ = bVar1;
  return;
}

Assistant:

void ConstantPaddingLayerParams::InternalSwap(ConstantPaddingLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  padamounts_.InternalSwap(&other->padamounts_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(ConstantPaddingLayerParams, padtogivenoutputsizemode_)
      + sizeof(ConstantPaddingLayerParams::padtogivenoutputsizemode_)
      - PROTOBUF_FIELD_OFFSET(ConstantPaddingLayerParams, value_)>(
          reinterpret_cast<char*>(&value_),
          reinterpret_cast<char*>(&other->value_));
}